

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  type_conflict5 tVar1;
  char *pcVar2;
  int *piVar3;
  cpp_dec_float<100U,_int,_void> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar4;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  int i_1;
  int i;
  int idx;
  int enterIdx;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leastBest;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *cpen;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *cTest;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa6c;
  undefined4 in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa84;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa88;
  undefined1 local_530 [80];
  undefined1 local_4e0 [8];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb38;
  undefined1 local_490 [80];
  undefined1 local_440 [80];
  uint local_3f0;
  undefined4 local_3ec;
  undefined1 local_3e8 [80];
  undefined1 local_398 [80];
  undefined1 local_348 [80];
  undefined1 local_2f8 [80];
  undefined1 local_2a8 [80];
  uint local_258;
  int local_254;
  int local_250;
  undefined1 local_24c [80];
  undefined4 local_1fc;
  undefined1 local_1f8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  undefined8 local_190;
  DataKey local_180;
  undefined8 local_178;
  undefined4 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  undefined1 *local_140;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  uint *local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  uint *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined4 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  cpp_dec_float<100U,_int,_void> *local_58;
  undefined1 *local_50;
  cpp_dec_float<100U,_int,_void> *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  cpp_dec_float<100U,_int,_void> *local_28;
  undefined1 *local_20;
  cpp_dec_float<100U,_int,_void> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_190 = in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::coTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **)((in_RDI->m_backend).data._M_elems + 4));
  local_1a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x5ce652);
  local_1a8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x5ce672);
  local_1fc = 0xffffffff;
  local_168 = local_1f8;
  local_170 = &local_1fc;
  local_178 = 0;
  local_68 = local_170;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),(longlong)in_RDI,in_RDX);
  local_160 = local_24c;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDX);
  local_250 = -1;
  local_258 = IdxSet::size((IdxSet *)(in_RDI[3].m_backend.data._M_elems + 4));
  uVar4 = extraout_RDX;
  while (local_258 = local_258 - 1, -1 < (int)local_258) {
    pcVar2 = IdxSet::index((IdxSet *)(in_RDI[3].m_backend.data._M_elems + 4),
                           (char *)(ulong)local_258,(int)uVar4);
    local_254 = (int)pcVar2;
    local_78 = local_1a0 + local_254;
    local_70 = local_24c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    local_20 = local_2a8;
    local_28 = in_RDX;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_RDX);
    local_10 = local_2a8;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    local_8 = local_2a8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate(in_RDX);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x5ce82a);
    if (tVar1) {
      local_150 = local_348;
      local_158 = local_24c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      local_148 = local_1a8 + local_254;
      local_140 = local_398;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      local_130 = local_3e8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      local_e0 = local_24c;
      local_e8 = local_2f8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5ce94d);
      if (tVar1) {
        local_80 = local_190;
        local_88 = local_24c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        local_250 = local_254;
        local_98 = local_1a8 + local_254;
        local_90 = in_RDI[1].m_backend.data._M_elems + 0xc;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      }
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5ce9f6);
      in_stack_fffffffffffffa6c = CONCAT13(1,(int3)in_stack_fffffffffffffa6c);
      uVar4 = extraout_RDX_00;
      if (!tVar1) {
        local_3ec = 0;
        tVar1 = boost::multiprecision::operator<(in_RDI,(int *)in_RDX);
        in_stack_fffffffffffffa6c = CONCAT13(tVar1,(int3)in_stack_fffffffffffffa6c);
        uVar4 = extraout_RDX_01;
      }
      if ((char)((uint)in_stack_fffffffffffffa6c >> 0x18) != '\0') {
        local_a0 = local_1f8;
        local_a8 = local_24c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        uVar4 = extraout_RDX_02;
      }
    }
    else {
      IdxSet::remove((IdxSet *)(in_RDI[3].m_backend.data._M_elems + 4),(char *)(ulong)local_258);
      piVar3 = DataArray<int>::operator[]
                         ((DataArray<int> *)
                          (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xf50),local_254);
      *piVar3 = 0;
      uVar4 = extraout_RDX_03;
    }
  }
  local_3f0 = IdxSet::size((IdxSet *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xf10));
  uVar4 = extraout_RDX_04;
  while (local_3f0 = local_3f0 - 1, -1 < (int)local_3f0) {
    pcVar2 = IdxSet::index((IdxSet *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xf10),
                           (char *)(ulong)local_3f0,(int)uVar4);
    local_254 = (int)pcVar2;
    piVar3 = DataArray<int>::operator[]
                       ((DataArray<int> *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xf50)
                        ,local_254);
    uVar4 = extraout_RDX_05;
    if (*piVar3 == 1) {
      local_b8 = local_1a0 + local_254;
      local_b0 = local_24c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      local_50 = local_440;
      local_58 = in_RDX;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_59,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_RDX);
      local_40 = local_440;
      local_48 = local_58;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      local_38 = local_440;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate(in_RDX);
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5cec0e);
      if (tVar1) {
        local_120 = local_4e0;
        local_128 = local_24c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        local_118 = local_1a8 + local_254;
        local_110 = local_530;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        local_100 = &stack0xfffffffffffffa80;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        local_f0 = local_24c;
        local_f8 = local_490;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        tVar1 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x5ced25);
        uVar4 = extraout_RDX_06;
        if (tVar1) {
          tVar1 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x5ced43);
          if (tVar1) {
            local_c0 = local_190;
            local_c8 = local_24c;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                              CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
            local_250 = local_254;
            local_d8 = local_1a8 + local_254;
            local_d0 = in_RDI[1].m_backend.data._M_elems + 0xc;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      (in_RDX,(cpp_dec_float<100U,_int,_void> *)
                              CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          }
          piVar3 = DataArray<int>::operator[]
                             ((DataArray<int> *)
                              (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xf50),local_254);
          *piVar3 = 2;
          DIdxSet::addIdx((DIdxSet *)in_RDX,in_stack_fffffffffffffa6c);
          uVar4 = extraout_RDX_07;
        }
      }
      else {
        piVar3 = DataArray<int>::operator[]
                           ((DataArray<int> *)
                            (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xf50),local_254);
        *piVar3 = 0;
        uVar4 = extraout_RDX_08;
      }
    }
  }
  if (local_250 < 0) {
    SPxId::SPxId((SPxId *)0x5cee85);
  }
  else {
    local_180 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::coId(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
  }
  return (SPxId)local_180;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperDim(R& best, R feastol)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = cTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indeces for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = cTest[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, cpen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = cpen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
               bestPrices.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);
   else
      return SPxId();
}